

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O0

void __thiscall JsrtExternalObject::Mark(JsrtExternalObject *this,Recycler *recycler)

{
  code *pcVar1;
  JsrtContext *pJVar2;
  bool bVar3;
  JsrtExternalType *this_00;
  undefined4 *puVar4;
  void *pvVar5;
  undefined1 local_30 [8];
  JsrtCallbackState scope;
  JsTraceCallback traceCallback;
  Recycler *recycler_local;
  JsrtExternalObject *this_local;
  
  Memory::Recycler::SetNeedExternalWrapperTracing(recycler);
  this_00 = GetExternalType(this);
  scope.originalJsrtContext = (JsrtContext *)JsrtExternalType::GetJsTraceCallback(this_00);
  if (scope.originalJsrtContext == (JsrtContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0xba,"(nullptr != traceCallback)","nullptr != traceCallback");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_30,(ThreadContext *)0x0);
  pJVar2 = scope.originalJsrtContext;
  pvVar5 = GetSlotData(this);
  (*(code *)pJVar2)(pvVar5);
  JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_30);
  return;
}

Assistant:

void JsrtExternalObject::Mark(Recycler * recycler) 
{
#ifdef _CHAKRACOREBUILD
    recycler->SetNeedExternalWrapperTracing();
    JsTraceCallback traceCallback = this->GetExternalType()->GetJsTraceCallback();
    Assert(nullptr != traceCallback);
    JsrtCallbackState scope(nullptr);
    traceCallback(this->GetSlotData());
#else
    Assert(UNREACHED);
#endif
}